

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.cpp
# Opt level: O1

int __thiscall
jrtplib::RTCPCompoundPacketBuilder::AddAPPPacket
          (RTCPCompoundPacketBuilder *this,uint8_t subtype,uint32_t ssrc,uint8_t *name,void *appdata
          ,size_t appdatalen)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  RTPMemoryManager *pRVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  undefined4 extraout_var;
  byte *pbVar8;
  ushort uVar9;
  value_type local_40;
  
  iVar5 = -0x2a;
  if ((((this->arebuilding == true) && (iVar5 = -0x25, subtype < 0x20)) &&
      (iVar5 = -0x24, (appdatalen & 3) == 0)) && (iVar5 = -0x22, appdatalen < 0x3fff5)) {
    uVar1 = appdatalen + 0xc;
    sVar2 = this->appsize;
    sVar3 = this->byesize;
    sVar6 = SDES::NeededBytes(&this->sdes);
    sVar7 = Report::NeededBytes(&this->report);
    iVar5 = -0x2b;
    if (sVar7 + sVar6 + sVar2 + uVar1 + sVar3 <= this->maximumpacketsize) {
      pRVar4 = (this->super_RTCPCompoundPacket).super_RTPMemoryObject.mgr;
      if (pRVar4 == (RTPMemoryManager *)0x0) {
        pbVar8 = (byte *)operator_new__(uVar1);
      }
      else {
        iVar5 = (*pRVar4->_vptr_RTPMemoryManager[2])(pRVar4,uVar1,3);
        pbVar8 = (byte *)CONCAT44(extraout_var,iVar5);
      }
      if (pbVar8 == (byte *)0x0) {
        iVar5 = -1;
      }
      else {
        *pbVar8 = subtype | 0x80;
        uVar9 = (short)(appdatalen >> 2) + 2;
        *(ushort *)(pbVar8 + 2) = uVar9 * 0x100 | uVar9 >> 8;
        pbVar8[1] = 0xcc;
        *(uint32_t *)(pbVar8 + 4) =
             ssrc >> 0x18 | (ssrc & 0xff0000) >> 8 | (ssrc & 0xff00) << 8 | ssrc << 0x18;
        pbVar8[8] = *name;
        pbVar8[9] = name[1];
        pbVar8[10] = name[2];
        pbVar8[0xb] = name[3];
        if (appdatalen != 0) {
          memcpy(pbVar8 + 0xc,appdata,appdatalen);
        }
        local_40.packetdata = pbVar8;
        local_40.packetlength = uVar1;
        std::__cxx11::
        list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
        ::push_back(&this->apppackets,&local_40);
        this->appsize = this->appsize + uVar1;
        iVar5 = 0;
      }
    }
  }
  return iVar5;
}

Assistant:

int RTCPCompoundPacketBuilder::AddAPPPacket(uint8_t subtype,uint32_t ssrc,const uint8_t name[4],const void *appdata,size_t appdatalen)
{
	if (!arebuilding)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTBUILDING;
	if (subtype > 31)
		return ERR_RTP_RTCPCOMPPACKBUILDER_ILLEGALSUBTYPE;
	if ((appdatalen%4) != 0)
		return ERR_RTP_RTCPCOMPPACKBUILDER_ILLEGALAPPDATALENGTH;

	size_t appdatawords = appdatalen/4;

	if ((appdatawords+2) > 65535)
		return ERR_RTP_RTCPCOMPPACKBUILDER_APPDATALENTOOBIG;
	
	size_t packsize = sizeof(RTCPCommonHeader)+sizeof(uint32_t)*2+appdatalen;
#ifndef RTP_SUPPORT_RTCPUNKNOWN
	size_t totalotherbytes = appsize+byesize+sdes.NeededBytes()+report.NeededBytes();
#else
	size_t totalotherbytes = appsize+unknownsize+byesize+sdes.NeededBytes()+report.NeededBytes();
#endif // RTP_SUPPORT_RTCPUNKNOWN 

	if ((totalotherbytes + packsize) > maximumpacketsize)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT;

	uint8_t *buf;
	
	buf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_BUFFER_RTCPAPPPACKET) uint8_t[packsize];
	if (buf == 0)
		return ERR_RTP_OUTOFMEM;

	RTCPCommonHeader *hdr = (RTCPCommonHeader *)buf;

	hdr->version = 2;
	hdr->padding = 0;
	hdr->count = subtype;
	
	hdr->length = htons((uint16_t)(appdatawords+2));
	hdr->packettype = RTP_RTCPTYPE_APP;
	
	uint32_t *source = (uint32_t *)(buf+sizeof(RTCPCommonHeader));
	*source = htonl(ssrc);

	buf[sizeof(RTCPCommonHeader)+sizeof(uint32_t)+0] = name[0];
	buf[sizeof(RTCPCommonHeader)+sizeof(uint32_t)+1] = name[1];
	buf[sizeof(RTCPCommonHeader)+sizeof(uint32_t)+2] = name[2];
	buf[sizeof(RTCPCommonHeader)+sizeof(uint32_t)+3] = name[3];

	if (appdatalen > 0)
		memcpy((buf+sizeof(RTCPCommonHeader)+sizeof(uint32_t)*2),appdata,appdatalen);

	apppackets.push_back(Buffer(buf,packsize));
	appsize += packsize;
	
	return 0;
}